

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.h
# Opt level: O1

void __thiscall
mp::
AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertCtxPos(AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ItemType_conflict3 *alld,int param_2)

{
  double *pdVar1;
  int iVar2;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar3;
  int *piVar4;
  int *piVar5;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar6;
  long lVar7;
  long lVar8;
  Error *this_00;
  uint uVar9;
  int *piVar10;
  undefined4 in_register_00000014;
  int *piVar11;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  ItemType_conflict3 *pIVar12;
  ulong uVar13;
  const_iterator __end0;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  VarOrConst VVar18;
  NodeRange NVar19;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  vector<int,_std::allocator<int>_> flags;
  vector<double,_std::allocator<double>_> coefs;
  allocator_type local_3da;
  allocator_type local_3d9;
  double local_3d8;
  AlgConRhs<0> local_3d0;
  AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *local_3c8;
  vector<int,_std::allocator<int>_> local_3c0;
  int local_3a4;
  vector<double,_std::allocator<double>_> local_3a0;
  ulong local_388;
  double local_380;
  vector<double,_std::allocator<double>_> local_378;
  vector<int,_std::allocator<int>_> local_360;
  AlgConRhs<_1> local_348;
  double dStack_340;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> local_330;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_260;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> local_1c0;
  LinTerms local_120;
  LinTerms local_a8;
  
  piVar11 = (int *)CONCAT44(in_register_00000014,param_2);
  pFVar3 = (this->
           super_BasicFuncConstrCvt<mp::AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           ).
           super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           .mdl_cvt_;
  piVar4 = (alld->
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (alld->
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar4 == piVar5) {
    dVar14 = INFINITY;
    pIVar12 = alld;
  }
  else {
    piVar11 = piVar4;
    dVar16 = INFINITY;
    do {
      pIVar12 = (ItemType_conflict3 *)(long)*piVar11;
      dVar14 = (pFVar3->
               super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ).
               super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               .super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(long)pIVar12];
      if (dVar16 <= dVar14) {
        dVar14 = dVar16;
      }
      piVar11 = piVar11 + 1;
      dVar16 = dVar14;
    } while (piVar11 != piVar5);
  }
  local_3d0.rhs_ = -INFINITY;
  if (piVar4 != piVar5) {
    local_3d0.rhs_ = -INFINITY;
    piVar10 = piVar4;
    do {
      piVar11 = (int *)(long)*piVar10;
      dVar16 = (pFVar3->
               super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ).
               super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               .super_FlatModel<mp::DefaultFlatModelParams>.var_ub_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(long)piVar11];
      if (dVar16 <= local_3d0.rhs_) {
        dVar16 = local_3d0.rhs_;
      }
      local_3d0.rhs_ = dVar16;
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar5);
  }
  local_3c8 = this;
  if ((dVar14 <= -INFINITY) || (INFINITY <= local_3d0.rhs_)) {
    this_00 = (Error *)__cxa_allocate_exception(0x18,pIVar12,piVar11);
    Error::Error(this_00,(CStringRef)0x381053,-1);
  }
  else {
    if ((-2147483648.0 <= dVar14) && (local_3d0.rhs_ <= 2147483647.0)) {
      local_3d8 = round(dVar14);
      local_3d0.rhs_ = round(local_3d0.rhs_);
      local_330.
      super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
      .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
           (pointer)0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_3a0,(long)piVar5 - (long)piVar4 >> 2,(value_type_conflict *)&local_330,
                 (allocator_type *)&local_3c0);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_3c0,
                 (long)(alld->
                       super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                       ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(alld->
                       super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                       ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_330);
      pFVar3 = (local_3c8->
               super_BasicFuncConstrCvt<mp::AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
      iVar2 = (alld->super_FunctionalConstraint).result_var_;
      dVar14 = (pFVar3->
               super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ).
               super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               .super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar2];
      pdVar1 = (pFVar3->
               super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ).
               super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               .super_FlatModel<mp::DefaultFlatModelParams>.var_ub_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + iVar2;
      if ((dVar14 != *pdVar1) || (NAN(dVar14) || NAN(*pdVar1))) {
        lVar7 = (long)(alld->
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                      ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(alld->
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                      ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        lVar8 = lVar7 >> 2;
        auVar17._8_4_ = (int)(lVar7 >> 0x22);
        auVar17._0_8_ = lVar8;
        auVar17._12_4_ = 0x45300000;
        local_330.
        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
        .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
             (pointer)((auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0) + -1.0);
        if (local_3a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_3a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_3a0,
                     (iterator)
                     local_3a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_330);
        }
        else {
          *local_3a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (double)local_330.
                       super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                       .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p;
          local_3a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_3a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iVar2 = (alld->super_FunctionalConstraint).result_var_;
        local_330.
        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
        .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p._0_4_ = iVar2;
        if (local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_3c0,
                     (iterator)
                     local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_330);
        }
        else {
          *local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar2;
          local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        lVar7 = (long)(alld->
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                      ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(alld->
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                      ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        lVar8 = lVar7 >> 2;
        auVar15._8_4_ = (int)(lVar7 >> 0x22);
        auVar15._0_8_ = lVar8;
        auVar15._12_4_ = 0x45300000;
        dStack_340 = auVar15._8_8_ - 1.9342813113834067e+25;
        local_348.rhs_ = dStack_340 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)
        ;
      }
      else {
        local_348.rhs_ = 1.0;
        dStack_340 = 0.0;
      }
      uVar9 = (uint)local_3d8;
      local_3d8 = (double)(ulong)uVar9;
      local_388 = (ulong)(uint)(int)local_3d0.rhs_;
      if ((int)local_3d0.rhs_ + 1U != uVar9) {
        do {
          if ((alld->
              super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
              ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish !=
              (alld->
              super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
              ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start) {
            local_3d0.rhs_ = (double)local_3d8._0_4_;
            uVar13 = 0;
            do {
              pFVar6 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)(local_3c8->
                          super_BasicFuncConstrCvt<mp::AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          ).
                          super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          .mdl_cvt_;
              local_380 = 1.0;
              __l._M_len = 1;
              __l._M_array = &local_380;
              std::vector<double,_std::allocator<double>_>::vector(&local_378,__l,&local_3d9);
              local_3a4 = (alld->
                          super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                          ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13];
              __l_00._M_len = 1;
              __l_00._M_array = &local_3a4;
              std::vector<int,_std::allocator<int>_>::vector(&local_360,__l_00,&local_3da);
              LinTerms::LinTerms(&local_a8,&local_378,&local_360);
              AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
                        (&local_1c0,&local_a8,local_3d0,true);
              ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
              ConditionalConstraint(&local_330,&local_1c0);
              VVar18 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                       ::
                       AssignResult2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
                                 ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                                   *)pFVar6,&local_330);
              value = VVar18.field_1;
              if (((undefined1  [16])VVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                NVar19 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         ::MakeFixedVar(pFVar6,value.c_);
                value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar19.ir_;
              }
              local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13] = value.var_;
              if (6 < local_330.
                      super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                      .
                      super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                      .args_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                      m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
                operator_delete(local_330.
                                super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .
                                super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .args_.super_LinTerms.vars_.
                                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                                super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                                local_330.
                                super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .
                                super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .args_.super_LinTerms.vars_.
                                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
              }
              if (6 < local_330.
                      super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                      .
                      super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                      .args_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
                operator_delete(local_330.
                                super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .
                                super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .args_.super_LinTerms.coefs_.
                                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                                super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                                local_330.
                                super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .
                                super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .args_.super_LinTerms.coefs_.
                                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity <<
                                3);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330.
                     super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                     .
                     super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                     .args_.super_BasicConstraint.name_._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&local_330.
                             super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                             .
                             super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                             .args_.super_BasicConstraint.name_ + 0x10U)) {
                operator_delete(local_330.
                                super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .
                                super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .args_.super_BasicConstraint.name_._M_dataplus._M_p,
                                local_330.
                                super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .
                                super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .args_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330.
                     super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                     .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
                  &local_330.
                   super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                   .super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
                operator_delete(local_330.
                                super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                                _M_p,local_330.
                                     super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                                     .super_FunctionalConstraint.super_BasicConstraint.name_.field_2
                                     ._M_allocated_capacity + 1);
              }
              if (6 < local_1c0.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
                operator_delete(local_1c0.super_LinTerms.vars_.
                                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                                super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                                local_1c0.super_LinTerms.vars_.
                                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
              }
              if (6 < local_1c0.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
                operator_delete(local_1c0.super_LinTerms.coefs_.
                                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                                super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                                local_1c0.super_LinTerms.coefs_.
                                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity <<
                                3);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0.super_BasicConstraint.name_._M_dataplus._M_p !=
                  &local_1c0.super_BasicConstraint.name_.field_2) {
                operator_delete(local_1c0.super_BasicConstraint.name_._M_dataplus._M_p,
                                local_1c0.super_BasicConstraint.name_.field_2._M_allocated_capacity
                                + 1);
              }
              if (6 < local_a8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
                operator_delete(local_a8.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                                m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr
                                ,local_a8.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                                 m_data.super_small_vector_data_base<int_*,_unsigned_long>.
                                 m_capacity << 2);
              }
              if (6 < local_a8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
                operator_delete(local_a8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
                                m_data.super_small_vector_data_base<double_*,_unsigned_long>.
                                m_data_ptr,
                                local_a8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
                                m_data.super_small_vector_data_base<double_*,_unsigned_long>.
                                m_capacity << 3);
              }
              if (local_360.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_360.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_360.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_360.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_378.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_378.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_378.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_378.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < (ulong)((long)(alld->
                                            super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                                            ).args_.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)(alld->
                                            super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                                            ).args_.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 2));
          }
          pFVar6 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)(local_3c8->
                      super_BasicFuncConstrCvt<mp::AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                      ).
                      super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                      .mdl_cvt_;
          LinTerms::LinTerms(&local_120,&local_3a0,&local_3c0);
          AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                    (&local_260,&local_120,local_348,true);
          NVar19 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                   ::
                   AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                             ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                               *)pFVar6,&local_260);
          FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AutoLink(pFVar6,NVar19);
          if (6 < local_260.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                  m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
            operator_delete(local_260.super_LinTerms.vars_.
                            super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                            local_260.super_LinTerms.vars_.
                            super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
          }
          if (6 < local_260.super_LinTerms.coefs_.
                  super_small_vector_base<std::allocator<double>,_6U>.m_data.
                  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
            operator_delete(local_260.super_LinTerms.coefs_.
                            super_small_vector_base<std::allocator<double>,_6U>.m_data.
                            super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                            local_260.super_LinTerms.coefs_.
                            super_small_vector_base<std::allocator<double>,_6U>.m_data.
                            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260.super_BasicConstraint.name_._M_dataplus._M_p !=
              &local_260.super_BasicConstraint.name_.field_2) {
            operator_delete(local_260.super_BasicConstraint.name_._M_dataplus._M_p,
                            local_260.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1)
            ;
          }
          if (6 < local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
            operator_delete(local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                            local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
          }
          if (6 < local_120.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
            operator_delete(local_120.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
                            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                            local_120.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
                            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity
                            << 3);
          }
          iVar2 = SUB84(local_3d8,0);
          local_3d8 = (double)(ulong)(iVar2 + 1);
        } while (iVar2 != (int)local_388);
      }
      if (local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_3a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_3a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_3a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    this_00 = (Error *)__cxa_allocate_exception(0x18,pIVar12,piVar11);
    Error::Error(this_00,(CStringRef)0x38108a,-1);
  }
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void ConvertCtxPos(const ItemType& alld, int ) {
    const auto& args = alld.GetArguments();
    const auto lba_dbl = GetMC().lb_array(args);
    const auto uba_dbl = GetMC().ub_array(args);
    if (lba_dbl<=GetMC().MinusInfty() ||
        uba_dbl>=GetMC().Infty())
      MP_RAISE("MP2MIP: AllDiff on unbounded variables not implemented");
    if (lba_dbl<std::numeric_limits<int>::min() ||
        uba_dbl>std::numeric_limits<int>::max())
      MP_RAISE("MP2MIP: AllDiff on variables with domain "
               "out of integer range not implemented");
    const int lba = (int)std::round(lba_dbl);
    const int uba = (int)std::round(uba_dbl);
    std::vector<double> coefs(args.size(), 1.0);
    std::vector<int> flags(args.size());        // unary encoding flags
    double rhs = 1.0;
    if (!GetMC().is_fixed(alld.GetResultVar())) {  // implied version: b -> alldiff
      coefs.push_back(args.size()-1.0);
      flags.push_back(alld.GetResultVar());
      rhs = (double)args.size();
    }
    for (int v=lba; v!=uba+1; ++v) {            // for each value in the domain union
      for (size_t ivar = 0; ivar < args.size(); ++ivar) {
        flags[ivar] = GetMC().AssignResultVar2Args(
              CondLinConEQ( { {{1.0}, {args[ivar]}}, double(v) } ) );
      }
      GetMC().AddConstraint( LinConLE( {coefs, flags}, {rhs} ) );
    }
  }